

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v9::detail::count_digits<1,unsigned__int128>(unsigned___int128 n)

{
  undefined1 m [16];
  undefined4 in_EAX;
  int iVar1;
  undefined4 in_register_00000004;
  undefined8 unaff_retaddr;
  
  m._4_4_ = in_register_00000004;
  m._0_4_ = in_EAX;
  m._8_8_ = unaff_retaddr;
  iVar1 = count_digits<1,_unsigned___int128>::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&stack0xffffffffffffffff,(unsigned___int128)m);
  return iVar1;
}

Assistant:

FMT_CONSTEXPR auto count_digits(UInt n) -> int {
#ifdef FMT_BUILTIN_CLZ
  if (!is_constant_evaluated() && num_bits<UInt>() == 32)
    return (FMT_BUILTIN_CLZ(static_cast<uint32_t>(n) | 1) ^ 31) / BITS + 1;
#endif
  // Lambda avoids unreachable code warnings from NVHPC.
  return [](UInt m) {
    int num_digits = 0;
    do {
      ++num_digits;
    } while ((m >>= BITS) != 0);
    return num_digits;
  }(n);
}